

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set-pseudo-dt-data-loc.cpp
# Opt level: O1

_tGetPathElemsSuffixRelRet * __thiscall
yactfr::internal::DataLocSetter::_getPathElemsSuffixRel2
          (_tGetPathElemsSuffixRelRet *__return_storage_ptr__,DataLocSetter *this,
          PseudoDataLoc *pseudoDataLoc,const_iterator searchEntryIt)

{
  type tVar1;
  string msg;
  TextLocation loc;
  _tGetPathElemsSuffixRelRet *p_Var2;
  type tVar3;
  pointer poVar4;
  pointer poVar5;
  PathElems normPathElems;
  PathElements pathElemsSuffix;
  undefined8 in_stack_ffffffffffffff50;
  pointer poVar6;
  pointer poVar7;
  pointer poVar8;
  type local_88;
  _tGetPathElemsSuffixRelRet *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = __return_storage_ptr__;
  if (pseudoDataLoc->_kind != Rel2) {
    __assert_fail("pseudoDataLoc.kind() == PseudoDataLoc::Kind::Rel2",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/set-pseudo-dt-data-loc.cpp"
                  ,0x7c,
                  "_tGetPathElemsSuffixRelRet yactfr::internal::DataLocSetter::_getPathElemsSuffixRel2(const PseudoDataLoc &, _tMemberNames::const_iterator) const"
                 );
  }
  poVar4 = (pointer)0x0;
  poVar6 = (pointer)0x0;
  poVar8 = (pointer)0x0;
  poVar5 = (pseudoDataLoc->_pathElems).
           super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (poVar5 != (pseudoDataLoc->_pathElems).
                super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    poVar7 = poVar6;
    do {
      if ((poVar5->super_type).m_initialized == true) {
        std::
        vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::push_back((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&stack0xffffffffffffff58,poVar5);
        poVar6 = poVar7;
      }
      else if (poVar4 == poVar7) {
        local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
        std::
        vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
        ::emplace_back<boost::optional<std::__cxx11::string>>
                  ((vector<boost::optional<std::__cxx11::string>,std::allocator<boost::optional<std::__cxx11::string>>>
                    *)&stack0xffffffffffffff58,
                   (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88);
        poVar6 = poVar7;
        if (local_88.m_initialized == true) {
          if (local_88.m_storage.dummy_.aligner_ != (type)((long)&local_88.m_storage.dummy_ + 0x10))
          {
            operator_delete((void *)local_88.m_storage.dummy_.aligner_,
                            local_88.m_storage.dummy_._16_8_ + 1);
            poVar6 = poVar7;
          }
          local_88._0_8_ = local_88._0_8_ & 0xffffffffffffff00;
        }
      }
      else {
        poVar6 = poVar7 + -1;
        if (poVar7[-1].super_type.m_initialized == true) {
          tVar1 = poVar7[-1].super_type.m_storage.dummy_.aligner_;
          tVar3 = (type)((long)&poVar7[-1].super_type.m_storage.dummy_ + 0x10);
          poVar7 = poVar6;
          if (tVar1 != tVar3) {
            operator_delete((void *)tVar1,*(long *)tVar3 + 1);
          }
          (poVar6->super_type).m_initialized = false;
          poVar6 = poVar7;
        }
      }
      poVar5 = poVar5 + 1;
      poVar7 = poVar6;
    } while (poVar5 != (pseudoDataLoc->_pathElems).
                       super__Vector_base<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_88.m_initialized = false;
  local_88._1_7_ = 0;
  local_88.m_storage.dummy_.aligner_ = (type)0x0;
  local_88.m_storage.dummy_._8_8_ = 0;
  if (poVar4 != poVar6) {
    poVar5 = poVar4;
    poVar7 = poVar6;
    do {
      if ((poVar4->super_type).m_initialized == true) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_88,(value_type *)&(poVar4->super_type).m_storage);
      }
      else {
        if (searchEntryIt._M_current ==
            (this->_memberNames).
            super__Vector_base<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>,_std::allocator<std::vector<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_50[0] = local_40;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_50,"Cannot reach the parent of the root scope.","");
          msg.field_2._8_8_ = in_stack_ffffffffffffff50;
          msg._0_24_ = pseudoDataLoc->_loc;
          loc._lineNumber = (Index)poVar7;
          loc._offset = (Index)poVar5;
          loc._colNumber = (Index)poVar8;
          throwTextParseError(msg,loc);
        }
        searchEntryIt._M_current = searchEntryIt._M_current + -1;
      }
      poVar4 = poVar4 + 1;
    } while (poVar4 != poVar6);
  }
  p_Var2 = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_58->first,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  (p_Var2->second)._M_current = searchEntryIt._M_current;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_88);
  std::
  vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)&stack0xffffffffffffff58);
  return p_Var2;
}

Assistant:

_tGetPathElemsSuffixRelRet _getPathElemsSuffixRel2(const PseudoDataLoc& pseudoDataLoc,
                                                       _tMemberNames::const_iterator searchEntryIt) const
    {
        assert(pseudoDataLoc.kind() == PseudoDataLoc::Kind::Rel2);

        // normalize the path (remove any unnecessary "parent" item)
        PseudoDataLoc::PathElems normPathElems;

        for (auto it = pseudoDataLoc.pathElems().begin();
                it != pseudoDataLoc.pathElems().end(); ++it) {
            if (*it) {
                // add member name
                normPathElems.push_back(*it);
            } else {
                // "parent"
                if (normPathElems.empty()) {
                    // empty path: add parent
                    normPathElems.push_back(boost::none);
                } else {
                    normPathElems.pop_back();
                }
            }
        }

        // now iterate the normalized path
        DataLocation::PathElements pathElemsSuffix;

        for (auto& pathElem : normPathElems) {
            if (pathElem) {
                // append as suffix
                pathElemsSuffix.push_back(*pathElem);
            } else {
                // go to parent, if any
                if (searchEntryIt == _memberNames.begin()) {
                    throwTextParseError("Cannot reach the parent of the root scope.",
                                        pseudoDataLoc.loc());
                }

                --searchEntryIt;
            }
        }

        return {pathElemsSuffix, searchEntryIt};
    }